

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O2

void __thiscall QTipLabel::paintEvent(QTipLabel *this,QPaintEvent *ev)

{
  long lVar1;
  long in_FS_OFFSET;
  undefined1 *local_98;
  QWidget *pQStack_90;
  QStyle *local_88;
  QStyleOptionFrame opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_88 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_90 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  QStylePainter::QStylePainter((QStylePainter *)&local_98,(QWidget *)this);
  opt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionFrame::QStyleOptionFrame(&opt);
  QStyleOption::initFrom(&opt.super_QStyleOption,(QWidget *)this);
  QStylePainter::drawPrimitive((QStylePainter *)&local_98,PE_PanelTipLabel,&opt.super_QStyleOption);
  QPainter::end();
  QLabel::paintEvent(&this->super_QLabel,ev);
  QStyleOption::~QStyleOption(&opt.super_QStyleOption);
  QPainter::~QPainter((QPainter *)&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTipLabel::paintEvent(QPaintEvent *ev)
{
    QStylePainter p(this);
    QStyleOptionFrame opt;
    opt.initFrom(this);
    p.drawPrimitive(QStyle::PE_PanelTipLabel, opt);
    p.end();

    QLabel::paintEvent(ev);
}